

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_example.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  base_id<my_other_id_t> local_18;
  base_id<my_id_t> local_14;
  tag_t id_o_2;
  my_id_t id_2;
  my_other_id_t id_o_1;
  my_id_t id_1;
  
  id_2.super_base_id<my_id_t>.id = (base_id<my_id_t>)base_id<my_id_t>::get_next_id();
  id_o_2 = base_id<my_other_id_t>::get_next_id();
  local_14 = id_2.super_base_id<my_id_t>.id;
  poVar1 = std::operator<<((ostream *)&std::cout,"Both of these should show 0 : ");
  poVar1 = operator<<(poVar1,&id_2.super_base_id<my_id_t>);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = operator<<(poVar1,&local_14);
  std::operator<<(poVar1,"\n");
  local_18.id = (int)base_id<my_other_id_t>::get_next_id();
  poVar1 = std::operator<<((ostream *)&std::cout,"This should be 1 : ");
  poVar1 = operator<<(poVar1,&local_18);
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main() {

    my_id_t id_1 = my_id_t::get_next_id();
    my_other_id_t id_o_1 = my_other_id_t::get_next_id();

    auto id_2 = id_1;

    std::cout << "Both of these should show 0 : " << id_1 << ' ' << id_2 << "\n";

    auto id_o_2 = my_other_id_t::get_next_id();

    std::cout << "This should be 1 : " << id_o_2 << "\n";

    // This should fail to compile
    // id_o_2 = id_1;
}